

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraBddChangePolarity(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *bTemp;
  DdNode *bVarsNext;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bRes1;
  DdNode *bRes0;
  int LevelV;
  int LevelF;
  DdNode *bFR;
  DdNode *bRes;
  DdNode *bVars_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  if (bVars == dd->one) {
    return bFunc;
  }
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) != 0x7fffffff) {
    pDVar3 = cuddCacheLookup2(dd,extraBddChangePolarity,bFunc,bVars);
    if (pDVar3 != (DdNode *)0x0) {
      return pDVar3;
    }
    pDVar3 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
    iVar1 = dd->perm[pDVar3->index];
    iVar2 = dd->perm[bVars->index];
    if (iVar2 < iVar1) {
      bFR = extraBddChangePolarity(dd,bFunc,(bVars->type).kids.T);
    }
    else {
      if (pDVar3 == bFunc) {
        bF1 = (pDVar3->type).kids.E;
        bVarsNext = (pDVar3->type).kids.T;
      }
      else {
        bF1 = (DdNode *)((ulong)(pDVar3->type).kids.E ^ 1);
        bVarsNext = (DdNode *)((ulong)(pDVar3->type).kids.T ^ 1);
      }
      bTemp = bVars;
      if (iVar1 == iVar2) {
        bTemp = (bVars->type).kids.T;
      }
      bRes1 = extraBddChangePolarity(dd,bF1,bTemp);
      if (bRes1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)bRes1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)bRes1 & 0xfffffffffffffffe) + 4) + 1;
      pDVar4 = extraBddChangePolarity(dd,bVarsNext,bTemp);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,bRes1);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
      bF0 = pDVar4;
      if (iVar1 == iVar2) {
        bF0 = bRes1;
        bRes1 = pDVar4;
      }
      if (bRes1 == bF0) {
        bFR = bF0;
      }
      else if (((ulong)bF0 & 1) == 0) {
        bFR = cuddUniqueInter(dd,pDVar3->index,bF0,bRes1);
        if (bFR == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,bRes1);
          Cudd_RecursiveDeref(dd,bF0);
          return (DdNode *)0x0;
        }
      }
      else {
        pDVar3 = cuddUniqueInter(dd,pDVar3->index,(DdNode *)((ulong)bF0 ^ 1),
                                 (DdNode *)((ulong)bRes1 ^ 1));
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,bRes1);
          Cudd_RecursiveDeref(dd,bF0);
          return (DdNode *)0x0;
        }
        bFR = (DdNode *)((ulong)pDVar3 ^ 1);
      }
      *(int *)(((ulong)bRes1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)bRes1 & 0xfffffffffffffffe) + 4) + -1;
      *(int *)(((ulong)bF0 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)bF0 & 0xfffffffffffffffe) + 4) + -1;
    }
    cuddCacheInsert2(dd,extraBddChangePolarity,bFunc,bVars,bFR);
    return bFR;
  }
  return bFunc;
}

Assistant:

DdNode * extraBddChangePolarity( 
  DdManager * dd,    /* the DD manager */
  DdNode * bFunc, 
  DdNode * bVars) 
{
    DdNode * bRes;

    if ( bVars == b1 )
        return bFunc;
    if ( Cudd_IsConstant(bFunc) )
        return bFunc;

    if ( (bRes = cuddCacheLookup2(dd, extraBddChangePolarity, bFunc, bVars)) )
        return bRes;
    else
    {
        DdNode * bFR = Cudd_Regular(bFunc); 
        int LevelF   = dd->perm[bFR->index];
        int LevelV   = dd->perm[bVars->index];

        if ( LevelV < LevelF )
            bRes = extraBddChangePolarity( dd, bFunc, cuddT(bVars) );
        else // if ( LevelF <= LevelV )
        {
            DdNode * bRes0, * bRes1;             
            DdNode * bF0, * bF1;             
            DdNode * bVarsNext;

            // cofactor the functions
            if ( bFR != bFunc ) // bFunc is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }

            if ( LevelF == LevelV )
                bVarsNext = cuddT(bVars);
            else
                bVarsNext = bVars;

            bRes0 = extraBddChangePolarity( dd, bF0, bVarsNext );
            if ( bRes0 == NULL ) 
                return NULL;
            cuddRef( bRes0 );

            bRes1 = extraBddChangePolarity( dd, bF1, bVarsNext );
            if ( bRes1 == NULL ) 
            {
                Cudd_RecursiveDeref( dd, bRes0 );
                return NULL;
            }
            cuddRef( bRes1 );

            if ( LevelF == LevelV )
            { // swap the cofactors
                DdNode * bTemp;
                bTemp = bRes0;
                bRes0 = bRes1;
                bRes1 = bTemp;
            }

            /* only aRes0 and aRes1 are referenced at this point */

            /* consider the case when Res0 and Res1 are the same node */
            if ( bRes0 == bRes1 )
                bRes = bRes1;
            /* consider the case when Res1 is complemented */
            else if ( Cudd_IsComplement(bRes1) ) 
            {
                bRes = cuddUniqueInter(dd, bFR->index, Cudd_Not(bRes1), Cudd_Not(bRes0));
                if ( bRes == NULL ) 
                {
                    Cudd_RecursiveDeref(dd,bRes0);
                    Cudd_RecursiveDeref(dd,bRes1);
                    return NULL;
                }
                bRes = Cudd_Not(bRes);
            } 
            else 
            {
                bRes = cuddUniqueInter( dd, bFR->index, bRes1, bRes0 );
                if ( bRes == NULL ) 
                {
                    Cudd_RecursiveDeref(dd,bRes0);
                    Cudd_RecursiveDeref(dd,bRes1);
                    return NULL;
                }
            }
            cuddDeref( bRes0 );
            cuddDeref( bRes1 );
        }
            
        /* insert the result into cache */
        cuddCacheInsert2(dd, extraBddChangePolarity, bFunc, bVars, bRes);
        return bRes;
    }
}